

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::NewInnerFunction
          (ByteCodeWriter *this,RegSlot destinationRegister,uint index,RegSlot environmentRegister,
          bool isGenerator,RegSlot homeObjLocation)

{
  code *pcVar1;
  RegSlot RVar2;
  bool bVar3;
  RegSlot RVar4;
  RegSlot RVar5;
  undefined4 *puVar6;
  uint uVar7;
  OpCode opcode;
  FunctionBody *pFVar8;
  RegSlot RVar9;
  uint32 local_50;
  RegSlot local_4c;
  RegSlot local_48;
  RegSlot local_44;
  uint local_40;
  RegSlot local_3c;
  RegSlot local_38;
  RegSlot local_34;
  
  local_40 = index;
  CheckOpen(this);
  if (destinationRegister != 0xffffffff) {
    pFVar8 = this->m_functionWrite;
    local_34 = homeObjLocation;
    if (pFVar8 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar3) goto LAB_00894a92;
      *puVar6 = 0;
      pFVar8 = this->m_functionWrite;
    }
    RVar9 = local_34;
    RVar4 = FunctionBody::MapRegSlot(pFVar8,destinationRegister);
    if (environmentRegister != 0xffffffff) {
      pFVar8 = this->m_functionWrite;
      if (pFVar8 == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (!bVar3) goto LAB_00894a92;
        *puVar6 = 0;
        pFVar8 = this->m_functionWrite;
        RVar9 = local_34;
      }
      local_38 = FunctionBody::MapRegSlot(pFVar8,environmentRegister);
      local_3c = RVar4;
      if (isGenerator) {
        RVar4 = (uint)(RVar9 != 0xffffffff) * 4 + 0x167;
      }
      else if (((this->m_functionWrite->super_ParseableFunctionInfo).flags & Flags_StackNestedFunc)
               == Flags_None) {
        RVar4 = (uint)(RVar9 != 0xffffffff) * 4 + 0x166;
      }
      else {
        RVar4 = 0x168;
        if (RVar9 != 0xffffffff) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,0x934,"(!hasHomeObj)","!hasHomeObj");
          if (!bVar3) goto LAB_00894a92;
          *puVar6 = 0;
        }
      }
      opcode = (OpCode)RVar4;
      bVar3 = OpCodeAttr::HasMultiSizeLayout(opcode);
      uVar7 = local_40;
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x93b,"(OpCodeAttr::HasMultiSizeLayout(opcode))",
                                    "OpCodeAttr::HasMultiSizeLayout(opcode)");
        if (!bVar3) goto LAB_00894a92;
        *puVar6 = 0;
      }
      RVar5 = local_38;
      RVar2 = local_3c;
      if (RVar9 == 0xffffffff) {
        bVar3 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                          (this,opcode,local_3c,local_38,uVar7);
        if (bVar3) {
          return;
        }
        bVar3 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                          (this,opcode,RVar2,RVar5,uVar7);
        if (bVar3) {
          return;
        }
        local_4c = RVar2;
        local_48 = RVar5;
        local_50 = uVar7;
        Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,opcode,this);
        uVar7 = 0xc;
      }
      else {
        pFVar8 = this->m_functionWrite;
        if (pFVar8 == (FunctionBody *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
          if (!bVar3) goto LAB_00894a92;
          *puVar6 = 0;
          pFVar8 = this->m_functionWrite;
          RVar9 = local_34;
        }
        RVar5 = FunctionBody::MapRegSlot(pFVar8,RVar9);
        RVar2 = local_38;
        RVar9 = local_3c;
        local_34 = RVar4;
        bVar3 = TryWriteElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                          (this,opcode,local_3c,local_38,uVar7,RVar5);
        if (bVar3) {
          return;
        }
        bVar3 = TryWriteElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                          (this,(OpCode)local_34,RVar9,RVar2,uVar7,RVar5);
        if (bVar3) {
          return;
        }
        local_4c = RVar9;
        local_48 = RVar2;
        local_50 = uVar7;
        local_44 = RVar5;
        Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,(OpCode)local_34,this);
        uVar7 = 0x10;
      }
      Data::Write(&this->m_byteCodeData,&local_50,uVar7);
      return;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar6 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar3) {
    *puVar6 = 0;
    Throw::InternalError();
  }
LAB_00894a92:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::NewInnerFunction(RegSlot destinationRegister, uint index, RegSlot environmentRegister, bool isGenerator, RegSlot homeObjLocation)
    {
        CheckOpen();

        bool hasHomeObj = homeObjLocation != Js::Constants::NoRegister;

        destinationRegister = ConsumeReg(destinationRegister);
        environmentRegister = ConsumeReg(environmentRegister);
        OpCode opcode = OpCode::NewInnerScFunc;
        if (isGenerator)
        {
            opcode = hasHomeObj ? OpCode::NewInnerScGenFuncHomeObj : OpCode::NewInnerScGenFunc;
        }
        else if (this->m_functionWrite->DoStackNestedFunc())
        {
            Assert(!hasHomeObj);
            opcode = OpCode::NewInnerStackScFunc;
        }
        else if (hasHomeObj)
        {
            opcode = OpCode::NewInnerScFuncHomeObj;
        }
        Assert(OpCodeAttr::HasMultiSizeLayout(opcode));

        if (hasHomeObj)
        {
            homeObjLocation = ConsumeReg(homeObjLocation);
            MULTISIZE_LAYOUT_WRITE(ElementSlotI3, opcode, destinationRegister, environmentRegister, index, homeObjLocation);
        }
        else
        {
            MULTISIZE_LAYOUT_WRITE(ElementSlot, opcode, destinationRegister, environmentRegister, index);
        }
    }